

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void idx2::IncreaseCapacity<unsigned_long,idx2::file_cache>
               (hash_table<unsigned_long,_idx2::file_cache> *Ht)

{
  file_cache *Key;
  long lVar1;
  hash_table<unsigned_long,_idx2::file_cache> *Ht_00;
  long lVar2;
  file_cache *in_R8;
  long lVar3;
  long lVar4;
  hash_table<unsigned_long,_idx2::file_cache> NewHt;
  hash_table<unsigned_long,_idx2::file_cache> hStack_78;
  iterator local_40;
  
  hStack_78.Keys = (unsigned_long *)0x0;
  hStack_78.LogCapacity = 0;
  hStack_78.Alloc = (allocator *)0x0;
  hStack_78.Vals = (file_cache *)0x0;
  hStack_78.Stats = (bucket_status *)0x0;
  hStack_78.Size = 0;
  Init<unsigned_long,idx2::file_cache>(&hStack_78,Ht->LogCapacity + 1,Ht->Alloc);
  lVar3 = 1L << ((byte)Ht->LogCapacity & 0x3f);
  lVar4 = lVar3;
  if (Ht->LogCapacity != 0x3f) {
    lVar1 = 0;
    lVar2 = 0;
    if (0 < lVar3) {
      lVar2 = lVar3;
    }
    do {
      lVar4 = lVar1;
      if (Ht->Stats[lVar1] == Occupied) break;
      lVar1 = lVar1 + 1;
      lVar4 = lVar3;
    } while (lVar2 + 1 != lVar1);
  }
  if (lVar4 != 1L << ((byte)Ht->LogCapacity & 0x3f)) {
    Key = Ht->Vals + lVar4;
    Ht_00 = (hash_table<unsigned_long,_idx2::file_cache> *)(Ht->Keys + lVar4);
    do {
      Insert<unsigned_long,idx2::file_cache>
                (&local_40,(idx2 *)&hStack_78,Ht_00,(unsigned_long *)Key,in_R8);
      lVar3 = lVar4 * -0xd0;
      lVar2 = lVar4 * -8;
      do {
        lVar3 = lVar3 + -0xd0;
        lVar2 = lVar2 + -8;
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (Ht->Stats[lVar1] != Occupied);
      Ht_00 = (hash_table<unsigned_long,_idx2::file_cache> *)((long)Ht->Keys - lVar2);
      Key = (file_cache *)((long)Ht->Vals - lVar3);
    } while (1L << ((byte)Ht->LogCapacity & 0x3f) != lVar4);
  }
  Dealloc<unsigned_long,idx2::file_cache>(Ht);
  Ht->Stats = hStack_78.Stats;
  Ht->Size = hStack_78.Size;
  Ht->LogCapacity = hStack_78.LogCapacity;
  Ht->Alloc = hStack_78.Alloc;
  Ht->Keys = hStack_78.Keys;
  Ht->Vals = hStack_78.Vals;
  Ht->Stats = hStack_78.Stats;
  Ht->Size = hStack_78.Size;
  return;
}

Assistant:

void
IncreaseCapacity(hash_table<k, v>* Ht)
{
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
    Insert(&NewHt, *(It.Key), *(It.Val));
  Dealloc(Ht);
  *Ht = NewHt;
}